

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

ggml_tensor * __thiscall
llm_graph_context::build_pos_bias
          (llm_graph_context *this,ggml_tensor *pos_bucket,ggml_tensor *attn_rel_b)

{
  ggml_tensor *pgVar1;
  long lVar2;
  undefined8 uVar3;
  
  pgVar1 = (ggml_tensor *)
           ggml_reshape_1d(this->ctx0,pos_bucket,pos_bucket->ne[1] * pos_bucket->ne[0]);
  if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
              (this->cb_func,this->ubatch,pgVar1,"pos_bucket_1d",-1);
  }
  lVar2 = ggml_get_rows(this->ctx0,attn_rel_b,pgVar1);
  uVar3 = ggml_reshape_3d(this->ctx0,lVar2,*(undefined8 *)(lVar2 + 0x10),pos_bucket->ne[0],
                          pos_bucket->ne[1]);
  uVar3 = ggml_permute(this->ctx0,uVar3,2,0,1,3);
  pgVar1 = (ggml_tensor *)ggml_cont(this->ctx0,uVar3);
  if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
              (this->cb_func,this->ubatch,pgVar1,"pos_bias",-1);
  }
  return pgVar1;
}

Assistant:

ggml_tensor * llm_graph_context::build_pos_bias(ggml_tensor * pos_bucket, ggml_tensor * attn_rel_b) const {
    ggml_tensor * pos_bucket_1d = ggml_reshape_1d(ctx0, pos_bucket, pos_bucket->ne[0] * pos_bucket->ne[1]);
    cb(pos_bucket_1d, "pos_bucket_1d", -1);

    ggml_tensor * pos_bias = ggml_get_rows(ctx0, attn_rel_b, pos_bucket_1d);

    pos_bias = ggml_reshape_3d(ctx0, pos_bias, pos_bias->ne[0], pos_bucket->ne[0], pos_bucket->ne[1]);
    pos_bias = ggml_permute   (ctx0, pos_bias, 2, 0, 1, 3);
    pos_bias = ggml_cont      (ctx0, pos_bias);

    cb(pos_bias, "pos_bias", -1);

    return pos_bias;
}